

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS
ref_facelift_enclosing
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *param,REF_INT *cell,
          REF_DBL *bary)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  REF_LIST ref_list;
  REF_DBL *local_108;
  REF_CELL local_100;
  REF_GEOM local_f8;
  double local_f0;
  REF_DBL *local_e8;
  int *local_e0;
  REF_DBL current_bary [3];
  REF_INT nodes [27];
  REF_DBL local_48;
  REF_DBL RStack_40;
  undefined8 uStack_38;
  
  local_f8 = ref_facelift->grid->geom;
  *cell = -1;
  bary[2] = 0.0;
  *bary = 0.0;
  bary[1] = 0.0;
  local_108 = param;
  local_e8 = bary;
  local_e0 = cell;
  if (type == 2) {
    uVar4 = ref_list_create(&ref_list);
    if (uVar4 == 0) {
      pRVar2 = ref_facelift->tri_cell;
      local_48 = *local_108;
      RStack_40 = local_108[1];
      uStack_38 = 0;
      uVar4 = ref_search_touching(ref_facelift->face_search[(long)id + -1],ref_list,&local_48,1e-12)
      ;
      if (uVar4 == 0) {
        iVar5 = ref_list->n;
        local_100 = pRVar2;
        if (iVar5 < 1) {
          uVar4 = ref_list_free(ref_list);
          if (uVar4 == 0) {
            return 0;
          }
          uVar7 = 0x253;
          goto LAB_001cf8c1;
        }
        uVar11 = 0;
        uVar12 = 0xc08f3800;
        iVar9 = -1;
        for (lVar6 = 0; pRVar3 = local_e8, pRVar2 = local_100, lVar6 < iVar5; lVar6 = lVar6 + 1) {
          local_f0 = (double)CONCAT44(uVar12,uVar11);
          RVar1 = ref_list->value[lVar6];
          uVar4 = ref_cell_nodes(local_100,RVar1,nodes);
          if (uVar4 != 0) {
            uVar10 = (ulong)uVar4;
            pcVar8 = "cell";
            uVar7 = 0x25a;
            goto LAB_001cfa16;
          }
          nodes[3] = nodes[pRVar2->node_per];
          uVar4 = ref_geom_bary3(local_f8,nodes,local_108,current_bary);
          if (uVar4 != 0) {
            uVar10 = (ulong)uVar4;
            pcVar8 = "bary";
            uVar7 = 0x25c;
            goto LAB_001cfa16;
          }
          uVar11 = SUB84(current_bary[0],0);
          uVar12 = (undefined4)((ulong)current_bary[0] >> 0x20);
          if (current_bary[1] <= current_bary[0]) {
            uVar11 = SUB84(current_bary[1],0);
            uVar12 = (undefined4)((ulong)current_bary[1] >> 0x20);
          }
          if (current_bary[2] <= (double)CONCAT44(uVar12,uVar11)) {
            uVar11 = SUB84(current_bary[2],0);
            uVar12 = (undefined4)((ulong)current_bary[2] >> 0x20);
          }
          if (((double)CONCAT44(uVar12,uVar11) < local_f0 ||
              (double)CONCAT44(uVar12,uVar11) == local_f0) && iVar9 != -1) {
            uVar11 = SUB84(local_f0,0);
            uVar12 = (undefined4)((ulong)local_f0 >> 0x20);
            RVar1 = iVar9;
          }
          iVar9 = RVar1;
          iVar5 = ref_list->n;
        }
        if (iVar9 == -1) {
          uVar7 = 0x267;
          goto LAB_001cfa69;
        }
        *local_e0 = iVar9;
        uVar4 = ref_cell_nodes(local_100,iVar9,nodes);
        if (uVar4 == 0) {
          nodes[3] = nodes[pRVar2->node_per];
          uVar4 = ref_geom_bary3(local_f8,nodes,local_108,pRVar3);
          if (uVar4 == 0) {
            uVar4 = ref_list_free(ref_list);
            if (uVar4 == 0) {
              return 0;
            }
            uVar10 = (ulong)uVar4;
            pcVar8 = "free list";
            uVar7 = 0x270;
          }
          else {
            uVar10 = (ulong)uVar4;
            pcVar8 = "bary";
            uVar7 = 0x26c;
          }
        }
        else {
          uVar10 = (ulong)uVar4;
          pcVar8 = "cell";
          uVar7 = 0x26a;
        }
        goto LAB_001cfa16;
      }
      pcVar8 = "touching";
      uVar7 = 0x250;
    }
    else {
      pcVar8 = "create list";
      uVar7 = 0x249;
    }
  }
  else {
    if (type != 1) {
      return 0;
    }
    uVar4 = ref_list_create(&ref_list);
    if (uVar4 == 0) {
      pRVar2 = ref_facelift->edg_cell;
      local_48 = *local_108;
      RStack_40 = 0.0;
      uStack_38 = 0;
      uVar4 = ref_search_touching(ref_facelift->edge_search[(long)id + -1],ref_list,&local_48,1e-12)
      ;
      if (uVar4 == 0) {
        iVar5 = ref_list->n;
        local_100 = pRVar2;
        if (iVar5 < 1) {
          uVar4 = ref_list_free(ref_list);
          if (uVar4 == 0) {
            return 0;
          }
          uVar7 = 0x22d;
LAB_001cf8c1:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar7,"ref_facelift_enclosing",(ulong)uVar4,"free list");
          return uVar4;
        }
        uVar11 = 0;
        uVar12 = 0xc08f3800;
        iVar9 = -1;
        for (lVar6 = 0; pRVar3 = local_e8, pRVar2 = local_100, lVar6 < iVar5; lVar6 = lVar6 + 1) {
          local_f0 = (double)CONCAT44(uVar12,uVar11);
          RVar1 = ref_list->value[lVar6];
          uVar4 = ref_cell_nodes(local_100,RVar1,nodes);
          if (uVar4 != 0) {
            uVar10 = (ulong)uVar4;
            pcVar8 = "cell";
            uVar7 = 0x234;
            goto LAB_001cfa16;
          }
          nodes[2] = nodes[pRVar2->node_per];
          uVar4 = ref_geom_bary2(local_f8,nodes,*local_108,current_bary);
          if (uVar4 != 0) {
            uVar10 = (ulong)uVar4;
            pcVar8 = "bary";
            uVar7 = 0x236;
            goto LAB_001cfa16;
          }
          uVar11 = SUB84(current_bary[0],0);
          uVar12 = (undefined4)((ulong)current_bary[0] >> 0x20);
          if (current_bary[1] <= current_bary[0]) {
            uVar11 = SUB84(current_bary[1],0);
            uVar12 = (undefined4)((ulong)current_bary[1] >> 0x20);
          }
          if (((double)CONCAT44(uVar12,uVar11) < local_f0 ||
              (double)CONCAT44(uVar12,uVar11) == local_f0) && iVar9 != -1) {
            uVar11 = SUB84(local_f0,0);
            uVar12 = (undefined4)((ulong)local_f0 >> 0x20);
            RVar1 = iVar9;
          }
          iVar9 = RVar1;
          iVar5 = ref_list->n;
        }
        if (iVar9 == -1) {
          uVar7 = 0x23e;
LAB_001cfa69:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar7,"ref_facelift_enclosing","failed to find cell");
          return 1;
        }
        *local_e0 = iVar9;
        uVar4 = ref_cell_nodes(local_100,iVar9,nodes);
        if (uVar4 == 0) {
          nodes[2] = nodes[pRVar2->node_per];
          uVar4 = ref_geom_bary2(local_f8,nodes,*local_108,pRVar3);
          if (uVar4 == 0) {
            uVar4 = ref_list_free(ref_list);
            if (uVar4 == 0) {
              return 0;
            }
            uVar10 = (ulong)uVar4;
            pcVar8 = "free list";
            uVar7 = 0x245;
          }
          else {
            uVar10 = (ulong)uVar4;
            pcVar8 = "bary";
            uVar7 = 0x243;
          }
        }
        else {
          uVar10 = (ulong)uVar4;
          pcVar8 = "cell";
          uVar7 = 0x241;
        }
LAB_001cfa16:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               uVar7,"ref_facelift_enclosing",uVar10,pcVar8);
        return (REF_STATUS)uVar10;
      }
      pcVar8 = "touching";
      uVar7 = 0x22b;
    }
    else {
      pcVar8 = "create list";
      uVar7 = 0x224;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar7,
         "ref_facelift_enclosing",(ulong)uVar4,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_enclosing(REF_FACELIFT ref_facelift,
                                          REF_INT type, REF_INT id,
                                          REF_DBL *param, REF_INT *cell,
                                          REF_DBL *bary) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_CELL ref_cell;
  REF_DBL parampad[3];
  REF_DBL fuzz = 1.0e-12;
  REF_INT item, candidate, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL current_bary[3], best_bary, min_bary;
  REF_INT best_candidate;
  REF_BOOL verbose = REF_FALSE;

  *cell = REF_EMPTY;
  bary[0] = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;

  if (REF_GEOM_EDGE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_edge_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_edg(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = 0.0;
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary2(ref_geom, nodes, param[0], current_bary), "bary");
      min_bary = MIN(current_bary[0], current_bary[1]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary2(ref_geom, nodes, param[0], bary), "bary");

    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_GEOM_FACE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_face_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_tri(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = param[1];
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (verbose) printf("n touch %d\n", ref_list_n(ref_list));
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary3(ref_geom, nodes, param, current_bary), "bary");
      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (verbose)
        printf("bary %e %e %e\n", current_bary[0], current_bary[1],
               current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary3(ref_geom, nodes, param, bary), "bary");

    if (verbose) printf("best %e %e %e\n", bary[0], bary[1], bary[2]);

    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}